

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O0

int quicly_local_cid_on_lost(quicly_local_cid_set_t *set,uint64_t sequence)

{
  quicly_local_cid_set_t *set_00;
  uint64_t in_RSI;
  quicly_local_cid_set_t *in_RDI;
  size_t i;
  size_t in_stack_ffffffffffffffd8;
  int local_4;
  
  set_00 = (quicly_local_cid_set_t *)find_index(in_RDI,in_RSI);
  if (set_00 == (quicly_local_cid_set_t *)0xffffffffffffffff) {
    local_4 = has_pending(in_RDI);
  }
  else if (in_RDI->cids[(long)set_00].state == QUICLY_LOCAL_CID_STATE_DELIVERED) {
    local_4 = has_pending(in_RDI);
  }
  else {
    do_mark_pending(set_00,in_stack_ffffffffffffffd8);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int quicly_local_cid_on_lost(quicly_local_cid_set_t *set, uint64_t sequence)
{
    size_t i = find_index(set, sequence);
    if (i == SIZE_MAX)
        return has_pending(set);

    /* if it's already delivered, ignore the packet loss event (no need for retransmission) */
    if (set->cids[i].state == QUICLY_LOCAL_CID_STATE_DELIVERED)
        return has_pending(set);

    do_mark_pending(set, i);

    return 1;
}